

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall
btSoftBody::btSoftBody
          (btSoftBody *this,btSoftBodyWorldInfo *worldInfo,int node_count,btVector3 *x,btScalar *m)

{
  float *pfVar1;
  uint uVar2;
  Node *ptr;
  uint uVar3;
  Material *pMVar4;
  Node *pNVar5;
  btDbvtNode *pbVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  byte bVar11;
  float extraout_XMM0_Da;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  btScalar bVar15;
  float fVar16;
  btDbvtAabbMm box;
  btDbvtVolume local_50;
  
  bVar11 = 0;
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btSoftBody_00221308;
  (this->m_collisionDisabledObjects).m_ownsMemory = true;
  (this->m_collisionDisabledObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionDisabledObjects).m_size = 0;
  (this->m_collisionDisabledObjects).m_capacity = 0;
  this->m_softBodySolver = (btSoftBodySolver *)0x0;
  (this->m_cfg).m_vsequence.m_ownsMemory = true;
  (this->m_cfg).m_vsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_vsequence.m_size = 0;
  (this->m_cfg).m_vsequence.m_capacity = 0;
  (this->m_cfg).m_psequence.m_ownsMemory = true;
  (this->m_cfg).m_psequence.m_data = (_ *)0x0;
  (this->m_cfg).m_psequence.m_size = 0;
  (this->m_cfg).m_psequence.m_capacity = 0;
  (this->m_cfg).m_dsequence.m_ownsMemory = true;
  (this->m_cfg).m_dsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_dsequence.m_size = 0;
  (this->m_cfg).m_dsequence.m_capacity = 0;
  (this->m_pose).m_pos.m_ownsMemory = true;
  (this->m_pose).m_pos.m_data = (btVector3 *)0x0;
  (this->m_pose).m_pos.m_size = 0;
  (this->m_pose).m_pos.m_capacity = 0;
  (this->m_pose).m_wgh.m_ownsMemory = true;
  (this->m_pose).m_wgh.m_data = (float *)0x0;
  (this->m_pose).m_wgh.m_size = 0;
  (this->m_pose).m_wgh.m_capacity = 0;
  this->m_worldInfo = worldInfo;
  (this->m_notes).m_ownsMemory = true;
  (this->m_notes).m_data = (Note *)0x0;
  (this->m_notes).m_size = 0;
  (this->m_notes).m_capacity = 0;
  (this->m_nodes).m_ownsMemory = true;
  (this->m_nodes).m_data = (Node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (Link *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_faces).m_ownsMemory = true;
  (this->m_faces).m_data = (Face *)0x0;
  (this->m_faces).m_size = 0;
  (this->m_faces).m_capacity = 0;
  (this->m_tetras).m_ownsMemory = true;
  (this->m_tetras).m_data = (Tetra *)0x0;
  (this->m_tetras).m_size = 0;
  (this->m_tetras).m_capacity = 0;
  (this->m_anchors).m_ownsMemory = true;
  (this->m_anchors).m_data = (Anchor *)0x0;
  (this->m_anchors).m_size = 0;
  (this->m_anchors).m_capacity = 0;
  (this->m_rcontacts).m_ownsMemory = true;
  (this->m_rcontacts).m_data = (RContact *)0x0;
  (this->m_rcontacts).m_size = 0;
  (this->m_rcontacts).m_capacity = 0;
  (this->m_scontacts).m_ownsMemory = true;
  (this->m_scontacts).m_data = (SContact *)0x0;
  (this->m_scontacts).m_size = 0;
  (this->m_scontacts).m_capacity = 0;
  (this->m_joints).m_ownsMemory = true;
  (this->m_joints).m_data = (Joint **)0x0;
  (this->m_joints).m_size = 0;
  (this->m_joints).m_capacity = 0;
  (this->m_materials).m_ownsMemory = true;
  (this->m_materials).m_data = (Material **)0x0;
  (this->m_materials).m_size = 0;
  (this->m_materials).m_capacity = 0;
  btDbvt::btDbvt(&this->m_ndbvt);
  btDbvt::btDbvt(&this->m_fdbvt);
  btDbvt::btDbvt(&this->m_cdbvt);
  (this->m_clusters).m_ownsMemory = true;
  (this->m_clusters).m_data = (Cluster **)0x0;
  (this->m_clusters).m_size = 0;
  (this->m_clusters).m_capacity = 0;
  (this->m_clusterConnectivity).m_ownsMemory = true;
  (this->m_clusterConnectivity).m_data = (bool *)0x0;
  (this->m_clusterConnectivity).m_size = 0;
  (this->m_clusterConnectivity).m_capacity = 0;
  (this->m_userIndexMapping).m_ownsMemory = true;
  (this->m_userIndexMapping).m_data = (int *)0x0;
  (this->m_userIndexMapping).m_size = 0;
  (this->m_userIndexMapping).m_capacity = 0;
  initDefaults(this);
  pMVar4 = appendMaterial(this);
  pMVar4->m_kLST = 1.0;
  pMVar4->m_kAST = 1.0;
  pMVar4->m_kVST = 1.0;
  pMVar4->m_flags = 1;
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  uVar2 = (this->m_nodes).m_size;
  if ((int)uVar2 < node_count) {
    if ((this->m_nodes).m_capacity < node_count) {
      if (node_count == 0) {
        pNVar5 = (Node *)0x0;
        uVar3 = uVar2;
      }
      else {
        pNVar5 = (Node *)btAlignedAllocInternal((long)node_count * 0x78,0x10);
        uVar3 = (this->m_nodes).m_size;
      }
      if (0 < (int)uVar3) {
        lVar8 = 0;
        do {
          puVar9 = (undefined8 *)
                   ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                           super_Element.m_tag + lVar8);
          puVar10 = (undefined8 *)
                    ((long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar8);
          for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar10 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          lVar8 = lVar8 + 0x78;
        } while ((ulong)uVar3 * 0x78 - lVar8 != 0);
      }
      ptr = (this->m_nodes).m_data;
      if ((ptr != (Node *)0x0) && ((this->m_nodes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_nodes).m_ownsMemory = true;
      (this->m_nodes).m_data = pNVar5;
      (this->m_nodes).m_capacity = node_count;
    }
    lVar7 = (long)node_count - (long)(int)uVar2;
    lVar8 = (long)(int)uVar2 * 0x78;
    do {
      pNVar5 = (this->m_nodes).m_data;
      puVar9 = (undefined8 *)((long)(&pNVar5->m_n + 1) + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_n).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_f).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_v).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_q).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_x).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)
               ((long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).super_Element.m_tag + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      *(undefined8 *)((long)(&pNVar5->m_n + 2) + lVar8) = 0;
      lVar8 = lVar8 + 0x78;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (this->m_nodes).m_size = node_count;
  if (0 < node_count) {
    lVar8 = 0;
    do {
      pNVar5 = (this->m_nodes).m_data;
      fVar12 = 0.0;
      fVar13 = 0.0;
      puVar9 = (undefined8 *)((long)(&pNVar5->m_n + 1) + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_n).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_f).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_v).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_q).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)((long)(pNVar5->m_x).m_floats + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9 = (undefined8 *)
               ((long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).super_Element.m_tag + lVar8);
      *puVar9 = 0;
      puVar9[1] = 0;
      *(undefined8 *)((long)(&pNVar5->m_n + 2) + lVar8) = 0;
      if (x == (btVector3 *)0x0) {
        x = (btVector3 *)0x0;
        uVar14 = 0;
      }
      else {
        fVar12 = (float)*(undefined8 *)x->m_floats;
        fVar13 = (float)((ulong)*(undefined8 *)x->m_floats >> 0x20);
        uVar14 = *(undefined8 *)(x->m_floats + 2);
        x = x + 1;
      }
      fVar16 = (float)uVar14;
      pfVar1 = (float *)((long)(pNVar5->m_x).m_floats + lVar8);
      *pfVar1 = fVar12;
      pfVar1[1] = fVar13;
      pfVar1[2] = fVar16;
      pfVar1[3] = (float)((ulong)uVar14 >> 0x20);
      puVar9 = (undefined8 *)((long)(pNVar5->m_x).m_floats + lVar8);
      uVar14 = puVar9[1];
      puVar10 = (undefined8 *)((long)(pNVar5->m_q).m_floats + lVar8);
      *puVar10 = *puVar9;
      puVar10[1] = uVar14;
      if (m == (btScalar *)0x0) {
        m = (btScalar *)0x0;
        bVar15 = 1.0;
      }
      else {
        bVar15 = *m;
        m = m + 1;
      }
      *(uint *)((long)(&pNVar5->m_n + 1) + lVar8) = -(uint)(0.0 < bVar15) & (uint)(1.0 / bVar15);
      local_50.mi.m_floats[1] = fVar13 - extraout_XMM0_Da;
      local_50.mi.m_floats[0] = fVar12 - extraout_XMM0_Da;
      local_50.mi.m_floats[2] = fVar16 - extraout_XMM0_Da;
      local_50.mi.m_floats[3] = 0.0;
      local_50.mx.m_floats[1] = extraout_XMM0_Da + fVar13;
      local_50.mx.m_floats[0] = extraout_XMM0_Da + fVar12;
      local_50.mx.m_floats[2] = extraout_XMM0_Da + fVar16;
      local_50.mx.m_floats[3] = 0.0;
      pbVar6 = btDbvt::insert(&this->m_ndbvt,&local_50,
                              (void *)((long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).
                                              super_Element.m_tag + lVar8));
      *(btDbvtNode **)((long)(&pNVar5->m_n + 1) + lVar8 + 8) = pbVar6;
      *(Material **)((long)(pNVar5->m_x).m_floats + lVar8 + -8) = pMVar4;
      lVar8 = lVar8 + 0x78;
    } while ((ulong)(uint)node_count * 0x78 - lVar8 != 0);
  }
  updateBounds(this);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo,int node_count,  const btVector3* x,  const btScalar* m)
:m_softBodySolver(0),m_worldInfo(worldInfo)
{	
	/* Init		*/ 
	initDefaults();

	/* Default material	*/ 
	Material*	pm=appendMaterial();
	pm->m_kLST	=	1;
	pm->m_kAST	=	1;
	pm->m_kVST	=	1;
	pm->m_flags	=	fMaterial::Default;

	/* Nodes			*/ 
	const btScalar		margin=getCollisionShape()->getMargin();
	m_nodes.resize(node_count);
	for(int i=0,ni=node_count;i<ni;++i)
	{	
		Node&	n=m_nodes[i];
		ZeroInitialize(n);
		n.m_x		=	x?*x++:btVector3(0,0,0);
		n.m_q		=	n.m_x;
		n.m_im		=	m?*m++:1;
		n.m_im		=	n.m_im>0?1/n.m_im:0;
		n.m_leaf	=	m_ndbvt.insert(btDbvtVolume::FromCR(n.m_x,margin),&n);
		n.m_material=	pm;
	}
	updateBounds();	

}